

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O1

void __thiscall TEST_PluginTest_Sequence_Test::testBody(TEST_PluginTest_Sequence_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  char *pcVar6;
  SimpleString local_48;
  SimpleString local_38;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  iVar2 = ((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->preActionSequence;
  pUVar3 = UtestShell::getCurrent();
  if (iVar2 == 1) {
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x91,pTVar4);
  }
  else {
    StringFrom((int)&local_38);
    pcVar5 = SimpleString::asCharString(&local_38);
    StringFrom((int)&local_48);
    pcVar6 = SimpleString::asCharString(&local_48);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x91,pTVar4);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&local_38);
  }
  iVar2 = ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->preActionSequence;
  pUVar3 = UtestShell::getCurrent();
  if (iVar2 == 2) {
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x92,pTVar4);
  }
  else {
    StringFrom((int)&local_38);
    pcVar5 = SimpleString::asCharString(&local_38);
    StringFrom((int)&local_48);
    pcVar6 = SimpleString::asCharString(&local_48);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x92,pTVar4);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&local_38);
  }
  iVar2 = ((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->postActionSequence;
  pUVar3 = UtestShell::getCurrent();
  if (iVar2 == 3) {
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x93,pTVar4);
  }
  else {
    StringFrom((int)&local_38);
    pcVar5 = SimpleString::asCharString(&local_38);
    StringFrom((int)&local_48);
    pcVar6 = SimpleString::asCharString(&local_48);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x93,pTVar4);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&local_38);
  }
  iVar2 = ((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->postActionSequence;
  pUVar3 = UtestShell::getCurrent();
  if (iVar2 == 4) {
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x94,pTVar4);
  }
  else {
    StringFrom((int)&local_38);
    pcVar5 = SimpleString::asCharString(&local_38);
    StringFrom((int)&local_48);
    pcVar6 = SimpleString::asCharString(&local_48);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x94,pTVar4);
    SimpleString::~SimpleString(&local_48);
    SimpleString::~SimpleString(&local_38);
  }
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x95,pTVar4);
  return;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}